

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

void __thiscall QUtcTimeZonePrivate::QUtcTimeZonePrivate(QUtcTimeZonePrivate *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QTimeZonePrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  (this->super_QTimeZonePrivate).m_id.d.size = 0;
  (this->super_QTimeZonePrivate).m_id.d.d = (Data *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.ptr = (char *)0x0;
  (this->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QUtcTimeZonePrivate_00669fa8;
  (this->m_name).d.d = (Data *)0x0;
  (this->m_name).d.ptr = (char16_t *)0x0;
  (this->m_name).d.size = 0;
  (this->m_abbreviation).d.d = (Data *)0x0;
  (this->m_abbreviation).d.ptr = (char16_t *)0x0;
  (this->m_abbreviation).d.size = 0;
  (this->m_comment).d.d = (Data *)0x0;
  (this->m_comment).d.ptr = (char16_t *)0x0;
  (this->m_comment).d.size = 0;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZonePrivate::utcQString();
  QTimeZonePrivate::utcQByteArray();
  init(this,(EVP_PKEY_CTX *)&local_60);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUtcTimeZonePrivate::QUtcTimeZonePrivate()
{
    const QString name = utcQString();
    init(utcQByteArray(), 0, name, name, QLocale::AnyTerritory, name);
}